

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::OrderLinkEntires(cmComputeLinkDepends *this)

{
  bool bVar1;
  cmComputeComponentGraph *this_00;
  size_type sVar2;
  reference piVar3;
  pointer ppVar4;
  reference piVar5;
  _Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_> local_68;
  _Rb_tree_const_iterator<int> local_60;
  int local_58;
  int local_54;
  int e;
  int originalEntry;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  value_type local_2d;
  int c;
  vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> *pvStack_28;
  int n;
  Graph *cgraph;
  cmComputeLinkDepends *local_10;
  cmComputeLinkDepends *this_local;
  
  local_10 = this;
  this_00 = (cmComputeComponentGraph *)operator_new(0xd8);
  cmComputeComponentGraph::cmComputeComponentGraph(this_00,&this->EntryConstraintGraph);
  this->CCG = this_00;
  pvStack_28 = &cmComputeComponentGraph::GetComponentGraph(this->CCG)->
                super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>;
  sVar2 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size(pvStack_28);
  c = (int)sVar2;
  sVar2 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size(pvStack_28);
  local_2d = '\0';
  std::vector<char,_std::allocator<char>_>::resize(&this->ComponentVisited,sVar2,&local_2d);
  sVar2 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size(pvStack_28);
  std::vector<int,_std::allocator<int>_>::resize(&this->ComponentOrder,sVar2,&c);
  this->ComponentOrderId = c;
  __range1._4_4_ = c;
  while (__range1._4_4_ = __range1._4_4_ - 1, -1 < (int)__range1._4_4_) {
    VisitComponent(this,__range1._4_4_);
  }
  if ((this->DebugMode & 1U) != 0) {
    DisplayComponents(this);
  }
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->OriginalEntries);
  _e = std::vector<int,_std::allocator<int>_>::end(&this->OriginalEntries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&e), bVar1) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    local_54 = *piVar3;
    VisitEntry(this,local_54);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  while (bVar1 = std::
                 map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
                 ::empty(&this->PendingComponents), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_68._M_node =
         (_Base_ptr)
         std::
         map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
         ::begin(&this->PendingComponents);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>::
             operator->(&local_68);
    local_60._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&(ppVar4->second).Entries);
    piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&local_60);
    local_58 = *piVar5;
    VisitEntry(this,local_58);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::OrderLinkEntires()
{
  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG = new cmComputeComponentGraph(this->EntryConstraintGraph);

  // The component graph is guaranteed to be acyclic.  Start a DFS
  // from every entry to compute a topological order for the
  // components.
  Graph const& cgraph = this->CCG->GetComponentGraph();
  int n = static_cast<int>(cgraph.size());
  this->ComponentVisited.resize(cgraph.size(), 0);
  this->ComponentOrder.resize(cgraph.size(), n);
  this->ComponentOrderId = n;
  // Run in reverse order so the topological order will preserve the
  // original order where there are no constraints.
  for (int c = n - 1; c >= 0; --c) {
    this->VisitComponent(c);
  }

  // Display the component graph.
  if (this->DebugMode) {
    this->DisplayComponents();
  }

  // Start with the original link line.
  for (int originalEntry : this->OriginalEntries) {
    this->VisitEntry(originalEntry);
  }

  // Now explore anything left pending.  Since the component graph is
  // guaranteed to be acyclic we know this will terminate.
  while (!this->PendingComponents.empty()) {
    // Visit one entry from the first pending component.  The visit
    // logic will update the pending components accordingly.  Since
    // the pending components are kept in topological order this will
    // not repeat one.
    int e = *this->PendingComponents.begin()->second.Entries.begin();
    this->VisitEntry(e);
  }
}